

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5FindTokenizer(fts5_api *pApi,char *zName,void **ppUserData,fts5_tokenizer *pTokenizer)

{
  Fts5TokenizerModule *pFVar1;
  Fts5TokenizerModule *pMod;
  int rc;
  fts5_tokenizer *pTokenizer_local;
  void **ppUserData_local;
  char *zName_local;
  fts5_api *pApi_local;
  
  pFVar1 = fts5LocateTokenizer((Fts5Global *)pApi,zName);
  if (pFVar1 == (Fts5TokenizerModule *)0x0) {
    memset(pTokenizer,0,0x18);
  }
  else {
    pTokenizer->xCreate = (pFVar1->x).xCreate;
    pTokenizer->xDelete = (pFVar1->x).xDelete;
    pTokenizer->xTokenize = (pFVar1->x).xTokenize;
    *ppUserData = pFVar1->pUserData;
  }
  pMod._4_4_ = (uint)(pFVar1 == (Fts5TokenizerModule *)0x0);
  return pMod._4_4_;
}

Assistant:

static int fts5FindTokenizer(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void **ppUserData,
  fts5_tokenizer *pTokenizer      /* Populate this object */
){
  int rc = SQLITE_OK;
  Fts5TokenizerModule *pMod;

  pMod = fts5LocateTokenizer((Fts5Global*)pApi, zName);
  if( pMod ){
    *pTokenizer = pMod->x;
    *ppUserData = pMod->pUserData;
  }else{
    memset(pTokenizer, 0, sizeof(fts5_tokenizer));
    rc = SQLITE_ERROR;
  }

  return rc;
}